

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_rshift_safe_into(mp_int *r,mp_int *x,size_t bits)

{
  ulong uVar1;
  
  uVar1 = x->nw;
  if (r->nw < x->nw) {
    uVar1 = r->nw;
  }
  memmove(r->w,x->w,uVar1 * 8);
  smemclr(r->w + uVar1,(r->nw - uVar1) * 8);
  mp_rshift_safe_in_place(r,bits);
  return;
}

Assistant:

void mp_rshift_safe_into(mp_int *r, mp_int *x, size_t bits)
{
    mp_copy_into(r, x);
    mp_rshift_safe_in_place(r, bits);
}